

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O2

int run_test_getnameinfo_basic_ip4(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar2,&req,getnameinfo_req,(sockaddr *)&addr4,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      close_loop(puVar2);
      eval_a = 0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      eval_b = (int64_t)iVar1;
      if (eval_b == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar4 = "uv_loop_close(uv_default_loop())";
      pcVar3 = "0";
      uVar5 = 0x44;
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar5 = 0x40;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar5 = 0x39;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getnameinfo.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip4) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;

  r = uv_ip4_addr(address_ip4, port, &addr4);
  ASSERT_OK(r);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr4,
                     0);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}